

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QGraphicsSceneBspTree::Node>::clear(QList<QGraphicsSceneBspTree::Node> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QGraphicsSceneBspTree::Node> *this_00;
  __off_t __length;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QGraphicsSceneBspTree::Node> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QGraphicsSceneBspTree::Node>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QGraphicsSceneBspTree::Node> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QGraphicsSceneBspTree::Node>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QGraphicsSceneBspTree::Node>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QGraphicsSceneBspTree::Node>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QGraphicsSceneBspTree::Node>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QGraphicsSceneBspTree::Node> *)
                QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QGraphicsSceneBspTree::Node>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }